

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall
OpenMD::EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(EqualIgnoreCaseConstraint *this)

{
  long in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x20));
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>::~ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)0x3190f6);
  return;
}

Assistant:

EqualIgnoreCaseConstraint(std::string rhs) :
        rhs_(OpenMD::toUpperCopy(rhs)) {
      std::stringstream iss;
      iss << "equal to (case insensitive) " << rhs;
      this->description_ = iss.str();
    }